

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O0

void test_sections_17(void)

{
  char *in_stack_00000590;
  char *in_stack_00000598;
  char *in_stack_000005a0;
  char *in_stack_000005a8;
  char *in_stack_000005b0;
  
  run(in_stack_000005b0,in_stack_000005a8,in_stack_000005a0,in_stack_00000598,in_stack_00000590);
  return;
}

Assistant:

static void
test_sections_17(void)
{
    run(
        "implicit iterators should cast decimals to strings and interpolate",
        "\"{{#list}}({{.}}){{/list}}\"",
        "{\"list\": [1.1, 2.2, 3.3, 4.4, 5.5]}",
        NULL,
        "\"(1.1)(2.2)(3.3)(4.4)(5.5)\""
    );
}